

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

String * __thiscall
Jinx::Impl::Parser::ParseName_abi_cxx11_(String *__return_storage_ptr__,Parser *this)

{
  pointer pSVar1;
  pointer pcVar2;
  Symbol *pSVar3;
  
  if ((this->m_error == false) &&
     (pSVar1 = (this->m_currentSymbol)._M_current,
     pSVar1 != (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish)) {
    if (pSVar1->type == NameValue) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (pSVar1->text)._M_dataplus._M_p;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                          __return_storage_ptr__,pcVar2,pcVar2 + (pSVar1->text)._M_string_length);
      pSVar3 = (this->m_currentSymbol)._M_current;
      this->m_lastLine = pSVar3->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar3 + 1;
      return __return_storage_ptr__;
    }
    Error<>(this,"Unexpected symbol type when parsing name");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::ParseName()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return String();
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing name");
			return String();
		}
		String s = String(m_currentSymbol->text);
		NextSymbol();
		return s;
	}